

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O0

int Sfm_TimReadObjDelay(Sfm_Tim_t *p,int iObj)

{
  int iVar1;
  int iObj_local;
  Sfm_Tim_t *p_local;
  
  iVar1 = Sfm_TimArrMaxId(p,iObj);
  return iVar1;
}

Assistant:

int Sfm_TimReadObjDelay( Sfm_Tim_t * p, int iObj )
{
    return Sfm_TimArrMaxId(p, iObj);
}